

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int __thiscall fmt::v7::detail::bigint::divmod_assign(bigint *this,bigint *divisor)

{
  uint uVar1;
  bigint *this_00;
  int iVar2;
  type tVar3;
  size_t sVar4;
  uint *puVar5;
  int local_38;
  int local_34;
  int quotient;
  int local_2c;
  int j;
  int i;
  int exp_difference;
  int num_bigits;
  bigint *divisor_local;
  bigint *this_local;
  
  _exp_difference = divisor;
  divisor_local = this;
  if (this == divisor) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                ,0x2e7,"");
  }
  iVar2 = compare(this,divisor);
  if (iVar2 < 0) {
    this_local._4_4_ = 0;
  }
  else {
    sVar4 = buffer<unsigned_int>::size((buffer<unsigned_int> *)this);
    this_00 = _exp_difference;
    i = (int)sVar4;
    sVar4 = buffer<unsigned_int>::size((buffer<unsigned_int> *)_exp_difference);
    puVar5 = buffer<unsigned_int>::operator[]<unsigned_long>
                       ((buffer<unsigned_int> *)this_00,sVar4 - 1);
    if (*puVar5 == 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                  ,0x2ea,"");
    }
    j = this->exp_ - _exp_difference->exp_;
    if (0 < j) {
      tVar3 = to_unsigned<int>(i + j);
      basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::resize
                (&this->bigits_,(ulong)tVar3);
      local_2c = i + -1;
      quotient = local_2c + j;
      for (; -1 < local_2c; local_2c = local_2c + -1) {
        puVar5 = buffer<unsigned_int>::operator[]<int>((buffer<unsigned_int> *)this,local_2c);
        uVar1 = *puVar5;
        puVar5 = buffer<unsigned_int>::operator[]<int>((buffer<unsigned_int> *)this,quotient);
        *puVar5 = uVar1;
        quotient = quotient + -1;
      }
      puVar5 = buffer<unsigned_int>::data((buffer<unsigned_int> *)this);
      local_34 = 0;
      std::uninitialized_fill_n<unsigned_int*,int,int>(puVar5,j,&local_34);
      this->exp_ = this->exp_ - j;
    }
    local_38 = 0;
    do {
      subtract_aligned(this,_exp_difference);
      local_38 = local_38 + 1;
      iVar2 = compare(this,_exp_difference);
      this_local._4_4_ = local_38;
    } while (-1 < iVar2);
  }
  return this_local._4_4_;
}

Assistant:

int divmod_assign(const bigint& divisor) {
    FMT_ASSERT(this != &divisor, "");
    if (compare(*this, divisor) < 0) return 0;
    int num_bigits = static_cast<int>(bigits_.size());
    FMT_ASSERT(divisor.bigits_[divisor.bigits_.size() - 1u] != 0, "");
    int exp_difference = exp_ - divisor.exp_;
    if (exp_difference > 0) {
      // Align bigints by adding trailing zeros to simplify subtraction.
      bigits_.resize(to_unsigned(num_bigits + exp_difference));
      for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
        bigits_[j] = bigits_[i];
      std::uninitialized_fill_n(bigits_.data(), exp_difference, 0);
      exp_ -= exp_difference;
    }
    int quotient = 0;
    do {
      subtract_aligned(divisor);
      ++quotient;
    } while (compare(*this, divisor) >= 0);
    return quotient;
  }